

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::start_hom_clique_proof
          (Proof *this,NamedVertex *p,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *p_clique,NamedVertex *t,
          map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *t_clique_neighbourhood)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var7;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar8;
  size_t sVar9;
  iterator iVar10;
  int iVar11;
  mapped_type *pmVar12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ostream *poVar16;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__y;
  pointer ppVar17;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__x;
  long *t_1;
  long *plVar18;
  bool bVar19;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *q;
  vector<long,_std::allocator<long>_> to_sum;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  pointer local_118;
  pointer local_110;
  pair<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  long *local_68;
  iterator iStack_60;
  long *local_58;
  pointer local_48;
  pointer local_40;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_move_assign(&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    p_clique,p_clique);
  std::
  map<int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(&((this->_imp)._M_t.
                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
               t_clique_neighbourhood,t_clique_neighbourhood);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* hom clique objective\n",0x17);
  local_68 = (long *)0x0;
  iStack_60._M_current = (long *)0x0;
  local_58 = (long *)0x0;
  _Var7._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  ppVar17 = *(pointer *)
             &((_Var7._M_head_impl)->p_clique).
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_118 = *(pointer *)((long)&(_Var7._M_head_impl)->p_clique + 8);
  if (ppVar17 != local_118) {
    do {
      uVar8._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar8._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,"u 1 ~x",6);
      local_108.first.first._0_8_ = SEXT48(p->first);
      local_108.first.first.second._M_dataplus._M_p = (pointer)(long)t->first;
      pmVar12 = std::
                map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->variable_mappings,(key_type *)&local_108);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar8._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      for (p_Var13 = *(_Base_ptr *)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 0x18);
          p_Var13 !=
          (_Rb_tree_node_base *)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 8U);
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        uVar8._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar8._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl," 1 x",4);
        local_108.first.first._0_8_ = SEXT48(ppVar17->first);
        local_108.first.first.second._M_dataplus._M_p = (pointer)(long)*(int *)&p_Var13[1]._M_parent
        ;
        pmVar12 = std::
                  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->variable_mappings,(key_type *)&local_108);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar8._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                 proof_stream)._M_t," >= 1 ;\n",8);
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      lVar14 = (_Var7._M_head_impl)->proof_line + 1;
      (_Var7._M_head_impl)->proof_line = lVar14;
      if (iStack_60._M_current == local_58) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_68,iStack_60,
                   &(_Var7._M_head_impl)->proof_line);
      }
      else {
        *iStack_60._M_current = lVar14;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 != local_118);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"p",1);
  iVar10._M_current = iStack_60._M_current;
  if (local_68 != iStack_60._M_current) {
    bVar19 = true;
    plVar18 = local_68;
    do {
      uVar8._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar8._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      std::ostream::_M_insert<long>
                ((long)uVar8._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl);
      if (!bVar19) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   proof_stream)._M_t," +",2);
      }
      plVar18 = plVar18 + 1;
      bVar19 = false;
    } while (plVar18 != iVar10._M_current);
  }
  local_108.first.first.first._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,(char *)&local_108,1);
  _Var7._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  lVar14 = (_Var7._M_head_impl)->proof_line + 1;
  (_Var7._M_head_impl)->proof_line = lVar14;
  (_Var7._M_head_impl)->objective_line = lVar14;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((_Var7._M_head_impl)->proof_stream)._M_t,
             "* hom clique non edges for injectivity\n",0x27);
  _Var7._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_1c8 = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)&((_Var7._M_head_impl)->p_clique).
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_48 = *(pointer *)((long)&(_Var7._M_head_impl)->p_clique + 8);
  if (local_1c8 != local_48) {
    paVar1 = &local_1b8.first.second.field_2;
    paVar4 = &local_108.first.second.second.field_2;
    paVar15 = &local_108.second.second.second.field_2;
    do {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      ppVar17 = *(pointer *)
                 &((_Var7._M_head_impl)->p_clique).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      local_110 = *(pointer *)((long)&(_Var7._M_head_impl)->p_clique + 8);
      if (ppVar17 != local_110) {
        do {
          if (((local_1c8->first != ppVar17->first) ||
              (sVar9 = (local_1c8->second)._M_string_length,
              sVar9 != (ppVar17->second)._M_string_length)) ||
             ((sVar9 != 0 &&
              (iVar11 = bcmp((local_1c8->second)._M_dataplus._M_p,(ppVar17->second)._M_dataplus._M_p
                             ,sVar9), iVar11 != 0)))) {
            _Var7._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            local_118 = *(pointer *)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 0x18);
            local_40 = (pointer)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 8);
            if (local_118 != local_40) {
              do {
                uVar8._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar8._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl,"u 1 ~x",6);
                lVar14 = (long)(local_118 + 1);
                local_108.first.first._0_8_ = SEXT48(local_1c8->first);
                local_108.first.first.second._M_dataplus._M_p = (pointer)(long)*(int *)lVar14;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_108);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     uVar8._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl,(pmVar12->_M_dataplus)._M_p,
                                     pmVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," 1 ~x",5);
                local_1b8.first._0_8_ = SEXT48(ppVar17->first);
                local_1b8.first.second._M_dataplus._M_p = (pointer)(long)*(int *)lVar14;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_1b8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," >= 1 ;\n",8);
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                plVar18 = &(_Var7._M_head_impl)->proof_line;
                *plVar18 = *plVar18 + 1;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1b8,local_1c8,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_168,ppVar17,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                local_108.first.first.first = local_1b8.first.first;
                paVar3 = &local_108.first.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p == paVar1) {
                  local_108.first.first.second.field_2._8_8_ = local_1b8.first.second.field_2._8_8_;
                  local_108.first.first.second._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_108.first.first.second._M_dataplus._M_p =
                       local_1b8.first.second._M_dataplus._M_p;
                }
                local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.first.second.field_2._M_local_buf[0] =
                     local_1b8.first.second.field_2._M_local_buf[0];
                local_108.first.first.second._M_string_length =
                     local_1b8.first.second._M_string_length;
                local_1b8.first.second._M_string_length = 0;
                local_1b8.first.second.field_2._M_local_buf[0] = '\0';
                local_108.first.second.first = local_1b8.second.first;
                paVar2 = &local_1b8.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p == paVar2) {
                  local_108.first.second.second.field_2._8_8_ =
                       local_1b8.second.second.field_2._8_8_;
                  local_108.first.second.second._M_dataplus._M_p = (pointer)paVar4;
                }
                else {
                  local_108.first.second.second._M_dataplus._M_p =
                       local_1b8.second.second._M_dataplus._M_p;
                }
                local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.second.second.field_2._M_local_buf[0] =
                     local_1b8.second.second.field_2._M_local_buf[0];
                local_108.first.second.second._M_string_length =
                     local_1b8.second.second._M_string_length;
                local_1b8.second.second._M_string_length = 0;
                local_1b8.second.second.field_2._M_local_buf[0] = '\0';
                local_108.second.first.first = local_168.first.first;
                local_108.second.first.second._M_dataplus._M_p =
                     (pointer)&local_108.second.first.second.field_2;
                paVar5 = &local_168.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p == paVar5) {
                  local_108.second.first.second.field_2._8_8_ = local_168.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_108.second.first.second._M_dataplus._M_p =
                       local_168.first.second._M_dataplus._M_p;
                }
                local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.first.second.field_2._M_local_buf[0] =
                     local_168.first.second.field_2._M_local_buf[0];
                local_108.second.first.second._M_string_length =
                     local_168.first.second._M_string_length;
                local_168.first.second._M_string_length = 0;
                local_168.first.second.field_2._M_local_buf[0] = '\0';
                local_108.second.second.first = local_168.second.first;
                paVar6 = &local_168.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p == paVar6) {
                  local_108.second.second.second.field_2._8_8_ =
                       local_168.second.second.field_2._8_8_;
                  local_108.second.second.second._M_dataplus._M_p = (pointer)paVar15;
                }
                else {
                  local_108.second.second.second._M_dataplus._M_p =
                       local_168.second.second._M_dataplus._M_p;
                }
                local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.second.second.field_2._M_local_buf[0] =
                     local_168.second.second.field_2._M_local_buf[0];
                local_108.second.second.second._M_string_length =
                     local_168.second.second._M_string_length;
                local_168.second.second._M_string_length = 0;
                local_168.second.second.field_2._M_local_buf[0] = '\0';
                local_1b8.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1b8.second.second._M_dataplus._M_p = (pointer)paVar2;
                local_168.first.second._M_dataplus._M_p = (pointer)paVar5;
                local_168.second.second._M_dataplus._M_p = (pointer)paVar6;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                            ->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.second.second._M_dataplus._M_p != paVar15) {
                  operator_delete(local_108.second.second.second._M_dataplus._M_p,
                                  local_108.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.first.second._M_dataplus._M_p !=
                    &local_108.second.first.second.field_2) {
                  operator_delete(local_108.second.first.second._M_dataplus._M_p,
                                  local_108.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.second.second._M_dataplus._M_p != paVar4) {
                  operator_delete(local_108.first.second.second._M_dataplus._M_p,
                                  local_108.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.first.second._M_dataplus._M_p != paVar3) {
                  operator_delete(local_108.first.first.second._M_dataplus._M_p,
                                  local_108.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p != &local_168.second.second.field_2)
                {
                  operator_delete(local_168.second.second._M_dataplus._M_p,
                                  CONCAT71(local_168.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p != &local_168.first.second.field_2) {
                  operator_delete(local_168.first.second._M_dataplus._M_p,
                                  CONCAT71(local_168.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p != &local_1b8.second.second.field_2)
                {
                  operator_delete(local_1b8.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1b8.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1b8,ppVar17,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_168,local_1c8,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                local_108.first.first.first = local_1b8.first.first;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p == paVar1) {
                  local_108.first.first.second.field_2._8_8_ = local_1b8.first.second.field_2._8_8_;
                  local_108.first.first.second._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_108.first.first.second._M_dataplus._M_p =
                       local_1b8.first.second._M_dataplus._M_p;
                }
                local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.first.second.field_2._M_local_buf[0] =
                     local_1b8.first.second.field_2._M_local_buf[0];
                local_108.first.first.second._M_string_length =
                     local_1b8.first.second._M_string_length;
                local_1b8.first.second._M_string_length = 0;
                local_1b8.first.second.field_2._M_local_buf[0] = '\0';
                local_108.first.second.first = local_1b8.second.first;
                paVar2 = &local_1b8.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p == paVar2) {
                  local_108.first.second.second.field_2._8_8_ =
                       local_1b8.second.second.field_2._8_8_;
                  local_108.first.second.second._M_dataplus._M_p = (pointer)paVar4;
                }
                else {
                  local_108.first.second.second._M_dataplus._M_p =
                       local_1b8.second.second._M_dataplus._M_p;
                }
                local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.second.second.field_2._M_local_buf[0] =
                     local_1b8.second.second.field_2._M_local_buf[0];
                local_108.first.second.second._M_string_length =
                     local_1b8.second.second._M_string_length;
                local_1b8.second.second._M_string_length = 0;
                local_1b8.second.second.field_2._M_local_buf[0] = '\0';
                local_108.second.first.first = local_168.first.first;
                local_108.second.first.second._M_dataplus._M_p =
                     (pointer)&local_108.second.first.second.field_2;
                paVar5 = &local_168.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p == paVar5) {
                  local_108.second.first.second.field_2._8_8_ = local_168.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_108.second.first.second._M_dataplus._M_p =
                       local_168.first.second._M_dataplus._M_p;
                }
                local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.first.second.field_2._M_local_buf[0] =
                     local_168.first.second.field_2._M_local_buf[0];
                local_108.second.first.second._M_string_length =
                     local_168.first.second._M_string_length;
                local_168.first.second._M_string_length = 0;
                local_168.first.second.field_2._M_local_buf[0] = '\0';
                local_108.second.second.first = local_168.second.first;
                paVar6 = &local_168.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p == paVar6) {
                  local_108.second.second.second.field_2._8_8_ =
                       local_168.second.second.field_2._8_8_;
                  local_108.second.second.second._M_dataplus._M_p = (pointer)paVar15;
                }
                else {
                  local_108.second.second.second._M_dataplus._M_p =
                       local_168.second.second._M_dataplus._M_p;
                }
                local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.second.second.field_2._M_local_buf[0] =
                     local_168.second.second.field_2._M_local_buf[0];
                local_108.second.second.second._M_string_length =
                     local_168.second.second._M_string_length;
                local_168.second.second._M_string_length = 0;
                local_168.second.second.field_2._M_local_buf[0] = '\0';
                local_1b8.first.second._M_dataplus._M_p = (pointer)paVar1;
                local_1b8.second.second._M_dataplus._M_p = (pointer)paVar2;
                local_168.first.second._M_dataplus._M_p = (pointer)paVar5;
                local_168.second.second._M_dataplus._M_p = (pointer)paVar6;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                            ->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.second.second._M_dataplus._M_p != paVar15) {
                  operator_delete(local_108.second.second.second._M_dataplus._M_p,
                                  local_108.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.first.second._M_dataplus._M_p !=
                    &local_108.second.first.second.field_2) {
                  operator_delete(local_108.second.first.second._M_dataplus._M_p,
                                  local_108.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.second.second._M_dataplus._M_p != paVar4) {
                  operator_delete(local_108.first.second.second._M_dataplus._M_p,
                                  local_108.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.first.second._M_dataplus._M_p != paVar3) {
                  operator_delete(local_108.first.first.second._M_dataplus._M_p,
                                  local_108.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p != &local_168.second.second.field_2)
                {
                  operator_delete(local_168.second.second._M_dataplus._M_p,
                                  CONCAT71(local_168.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p != &local_168.first.second.field_2) {
                  operator_delete(local_168.first.second._M_dataplus._M_p,
                                  CONCAT71(local_168.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p != &local_1b8.second.second.field_2)
                {
                  operator_delete(local_1b8.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1b8.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                local_118 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)local_118);
              } while (local_118 != local_40);
            }
          }
          ppVar17 = ppVar17 + 1;
        } while (ppVar17 != local_110);
      }
      local_1c8 = local_1c8 + 1;
    } while (local_1c8 != local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* hom clique non edges for variables\n",0x25);
  _Var7._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  __x = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          **)&((_Var7._M_head_impl)->p_clique).
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_38 = *(pointer *)((long)&(_Var7._M_head_impl)->p_clique + 8);
  if (__x != local_38) {
    paVar1 = &local_108.first.first.second.field_2;
    paVar4 = &local_108.first.second.second.field_2;
    paVar15 = &local_108.second.second.second.field_2;
    do {
      _Var7._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      local_110 = *(pointer *)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 0x18);
      local_48 = (pointer)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 8);
      if (local_110 != local_48) {
        do {
          _Var7._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          ppVar17 = *(pointer *)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 0x18);
          local_40 = (pointer)((long)&(_Var7._M_head_impl)->t_clique_neighbourhood + 8);
          if (ppVar17 != local_40) {
            __y = local_110 + 1;
            do {
              if (((__y->first != ppVar17[1].first) ||
                  (sVar9 = local_110[1].second._M_string_length,
                  sVar9 != *(size_t *)((long)(ppVar17 + 1) + 0x10))) ||
                 ((sVar9 != 0 &&
                  (iVar11 = bcmp(local_110[1].second._M_dataplus._M_p,
                                 *(void **)((long)(ppVar17 + 1) + 8),sVar9), iVar11 != 0)))) {
                uVar8._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar8._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl,"u 1 ~x",6);
                local_108.first.first._0_8_ = SEXT48(__x->first);
                local_108.first.first.second._M_dataplus._M_p = (pointer)(long)__y->first;
                local_118 = ppVar17;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_108);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     uVar8._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl,(pmVar12->_M_dataplus)._M_p,
                                     pmVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," 1 ~x",5);
                lVar14 = (long)(local_118 + 1);
                local_1b8.first._0_8_ = SEXT48(__x->first);
                local_1b8.first.second._M_dataplus._M_p = (pointer)(long)*(int *)lVar14;
                pmVar12 = std::
                          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                        _M_head_impl)->variable_mappings,(key_type *)&local_1b8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(pmVar12->_M_dataplus)._M_p,pmVar12->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," >= 1 ;\n",8);
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                plVar18 = &(_Var7._M_head_impl)->proof_line;
                *plVar18 = *plVar18 + 1;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1b8,__x,__y);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_168,__x,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                local_108.first.first.first = local_1b8.first.first;
                paVar3 = &local_1b8.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p == paVar3) {
                  local_108.first.first.second.field_2._8_8_ = local_1b8.first.second.field_2._8_8_;
                  local_108.first.first.second._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_108.first.first.second._M_dataplus._M_p =
                       local_1b8.first.second._M_dataplus._M_p;
                }
                local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.first.second.field_2._M_local_buf[0] =
                     local_1b8.first.second.field_2._M_local_buf[0];
                local_108.first.first.second._M_string_length =
                     local_1b8.first.second._M_string_length;
                local_1b8.first.second._M_string_length = 0;
                local_1b8.first.second.field_2._M_local_buf[0] = '\0';
                local_108.first.second.first = local_1b8.second.first;
                paVar2 = &local_1b8.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p == paVar2) {
                  local_108.first.second.second.field_2._8_8_ =
                       local_1b8.second.second.field_2._8_8_;
                  local_108.first.second.second._M_dataplus._M_p = (pointer)paVar4;
                }
                else {
                  local_108.first.second.second._M_dataplus._M_p =
                       local_1b8.second.second._M_dataplus._M_p;
                }
                local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.second.second.field_2._M_local_buf[0] =
                     local_1b8.second.second.field_2._M_local_buf[0];
                local_108.first.second.second._M_string_length =
                     local_1b8.second.second._M_string_length;
                local_1b8.second.second._M_string_length = 0;
                local_1b8.second.second.field_2._M_local_buf[0] = '\0';
                local_108.second.first.first = local_168.first.first;
                local_108.second.first.second._M_dataplus._M_p =
                     (pointer)&local_108.second.first.second.field_2;
                paVar5 = &local_168.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p == paVar5) {
                  local_108.second.first.second.field_2._8_8_ = local_168.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_108.second.first.second._M_dataplus._M_p =
                       local_168.first.second._M_dataplus._M_p;
                }
                local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.first.second.field_2._M_local_buf[0] =
                     local_168.first.second.field_2._M_local_buf[0];
                local_108.second.first.second._M_string_length =
                     local_168.first.second._M_string_length;
                local_168.first.second._M_string_length = 0;
                local_168.first.second.field_2._M_local_buf[0] = '\0';
                local_108.second.second.first = local_168.second.first;
                paVar6 = &local_168.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p == paVar6) {
                  local_108.second.second.second.field_2._8_8_ =
                       local_168.second.second.field_2._8_8_;
                  local_108.second.second.second._M_dataplus._M_p = (pointer)paVar15;
                }
                else {
                  local_108.second.second.second._M_dataplus._M_p =
                       local_168.second.second._M_dataplus._M_p;
                }
                local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.second.second.field_2._M_local_buf[0] =
                     local_168.second.second.field_2._M_local_buf[0];
                local_108.second.second.second._M_string_length =
                     local_168.second.second._M_string_length;
                local_168.second.second._M_string_length = 0;
                local_168.second.second.field_2._M_local_buf[0] = '\0';
                local_1b8.first.second._M_dataplus._M_p = (pointer)paVar3;
                local_1b8.second.second._M_dataplus._M_p = (pointer)paVar2;
                local_168.first.second._M_dataplus._M_p = (pointer)paVar5;
                local_168.second.second._M_dataplus._M_p = (pointer)paVar6;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                            ->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.second.second._M_dataplus._M_p != paVar15) {
                  operator_delete(local_108.second.second.second._M_dataplus._M_p,
                                  local_108.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.first.second._M_dataplus._M_p !=
                    &local_108.second.first.second.field_2) {
                  operator_delete(local_108.second.first.second._M_dataplus._M_p,
                                  local_108.second.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.second.second._M_dataplus._M_p != paVar4) {
                  operator_delete(local_108.first.second.second._M_dataplus._M_p,
                                  local_108.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_108.first.first.second._M_dataplus._M_p,
                                  local_108.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p != &local_168.second.second.field_2)
                {
                  operator_delete(local_168.second.second._M_dataplus._M_p,
                                  CONCAT71(local_168.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p != &local_168.first.second.field_2) {
                  operator_delete(local_168.first.second._M_dataplus._M_p,
                                  CONCAT71(local_168.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p != &local_1b8.second.second.field_2)
                {
                  operator_delete(local_1b8.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p != &local_1b8.first.second.field_2) {
                  operator_delete(local_1b8.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                _Var7._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_1b8,__x,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)lVar14);
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          (&local_168,__x,__y);
                local_108.first.first.first = local_1b8.first.first;
                paVar3 = &local_1b8.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p == paVar3) {
                  local_108.first.first.second.field_2._8_8_ = local_1b8.first.second.field_2._8_8_;
                  local_108.first.first.second._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_108.first.first.second._M_dataplus._M_p =
                       local_1b8.first.second._M_dataplus._M_p;
                }
                local_108.first.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.first.second.field_2._M_local_buf[0] =
                     local_1b8.first.second.field_2._M_local_buf[0];
                local_108.first.first.second._M_string_length =
                     local_1b8.first.second._M_string_length;
                local_1b8.first.second._M_string_length = 0;
                local_1b8.first.second.field_2._M_local_buf[0] = '\0';
                local_108.first.second.first = local_1b8.second.first;
                paVar2 = &local_1b8.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p == paVar2) {
                  local_108.first.second.second.field_2._8_8_ =
                       local_1b8.second.second.field_2._8_8_;
                  local_108.first.second.second._M_dataplus._M_p = (pointer)paVar4;
                }
                else {
                  local_108.first.second.second._M_dataplus._M_p =
                       local_1b8.second.second._M_dataplus._M_p;
                }
                local_108.first.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_1b8.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.first.second.second.field_2._M_local_buf[0] =
                     local_1b8.second.second.field_2._M_local_buf[0];
                local_108.first.second.second._M_string_length =
                     local_1b8.second.second._M_string_length;
                local_1b8.second.second._M_string_length = 0;
                local_1b8.second.second.field_2._M_local_buf[0] = '\0';
                local_108.second.first.first = local_168.first.first;
                local_108.second.first.second._M_dataplus._M_p =
                     (pointer)&local_108.second.first.second.field_2;
                paVar5 = &local_168.first.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p == paVar5) {
                  local_108.second.first.second.field_2._8_8_ = local_168.first.second.field_2._8_8_
                  ;
                }
                else {
                  local_108.second.first.second._M_dataplus._M_p =
                       local_168.first.second._M_dataplus._M_p;
                }
                local_108.second.first.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.first.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.first.second.field_2._M_local_buf[0] =
                     local_168.first.second.field_2._M_local_buf[0];
                local_108.second.first.second._M_string_length =
                     local_168.first.second._M_string_length;
                local_168.first.second._M_string_length = 0;
                local_168.first.second.field_2._M_local_buf[0] = '\0';
                local_108.second.second.first = local_168.second.first;
                paVar6 = &local_168.second.second.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p == paVar6) {
                  local_108.second.second.second.field_2._8_8_ =
                       local_168.second.second.field_2._8_8_;
                  local_108.second.second.second._M_dataplus._M_p = (pointer)paVar15;
                }
                else {
                  local_108.second.second.second._M_dataplus._M_p =
                       local_168.second.second._M_dataplus._M_p;
                }
                local_108.second.second.second.field_2._M_allocated_capacity._1_7_ =
                     local_168.second.second.field_2._M_allocated_capacity._1_7_;
                local_108.second.second.second.field_2._M_local_buf[0] =
                     local_168.second.second.field_2._M_local_buf[0];
                local_108.second.second.second._M_string_length =
                     local_168.second.second._M_string_length;
                local_168.second.second._M_string_length = 0;
                local_168.second.second.field_2._M_local_buf[0] = '\0';
                local_1b8.first.second._M_dataplus._M_p = (pointer)paVar3;
                local_1b8.second.second._M_dataplus._M_p = (pointer)paVar2;
                local_168.first.second._M_dataplus._M_p = (pointer)paVar5;
                local_168.second.second._M_dataplus._M_p = (pointer)paVar6;
                std::
                _Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                ::
                _M_emplace_unique<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,long&>
                          ((_Rb_tree<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>,std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>,std::_Select1st<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>,std::less<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>const,long>>>
                            *)&(_Var7._M_head_impl)->clique_for_hom_non_edge_constraints,&local_108,
                           &((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                            ->proof_line);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.second.second._M_dataplus._M_p != paVar15) {
                  operator_delete(local_108.second.second.second._M_dataplus._M_p,
                                  local_108.second.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.second.first.second._M_dataplus._M_p !=
                    &local_108.second.first.second.field_2) {
                  operator_delete(local_108.second.first.second._M_dataplus._M_p,
                                  local_108.second.first.second.field_2._M_allocated_capacity + 1);
                }
                ppVar17 = local_118;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.second.second._M_dataplus._M_p != paVar4) {
                  operator_delete(local_108.first.second.second._M_dataplus._M_p,
                                  local_108.first.second.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108.first.first.second._M_dataplus._M_p != paVar1) {
                  operator_delete(local_108.first.first.second._M_dataplus._M_p,
                                  local_108.first.first.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.second.second._M_dataplus._M_p != &local_168.second.second.field_2)
                {
                  operator_delete(local_168.second.second._M_dataplus._M_p,
                                  CONCAT71(local_168.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168.first.second._M_dataplus._M_p != &local_168.first.second.field_2) {
                  operator_delete(local_168.first.second._M_dataplus._M_p,
                                  CONCAT71(local_168.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_168.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.second._M_dataplus._M_p != &local_1b8.second.second.field_2)
                {
                  operator_delete(local_1b8.second.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.second.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.second.second.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first.second._M_dataplus._M_p != paVar3) {
                  operator_delete(local_1b8.first.second._M_dataplus._M_p,
                                  CONCAT71(local_1b8.first.second.field_2._M_allocated_capacity.
                                           _1_7_,local_1b8.first.second.field_2._M_local_buf[0]) + 1
                                 );
                }
              }
              ppVar17 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar17);
            } while (ppVar17 != local_40);
          }
          local_110 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)local_110);
        } while (local_110 != local_48);
      }
      __x = __x + 1;
    } while (__x != local_38);
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

auto Proof::start_hom_clique_proof(const NamedVertex & p, vector<NamedVertex> && p_clique, const NamedVertex & t, map<int, NamedVertex> && t_clique_neighbourhood) -> void
{
    _imp->p_clique = move(p_clique);
    _imp->t_clique_neighbourhood = move(t_clique_neighbourhood);

    *_imp->proof_stream << "* hom clique objective\n";
    vector<long> to_sum;
    for (auto & q : _imp->p_clique) {
        *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
        for (auto & u : _imp->t_clique_neighbourhood)
            *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.second.first}];
        *_imp->proof_stream << " >= 1 ;\n";
        to_sum.push_back(++_imp->proof_line);
    }

    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & t : to_sum) {
        *_imp->proof_stream << " " << t;
        if (! first)
            *_imp->proof_stream << " +";
        first = false;
    }
    *_imp->proof_stream << '\n';
    _imp->objective_line = ++_imp->proof_line;

    *_imp->proof_stream << "* hom clique non edges for injectivity\n";

    for (auto & p : _imp->p_clique)
        for (auto & q : _imp->p_clique)
            if (p != q) {
                for (auto & [_, t] : _imp->t_clique_neighbourhood) {
                    *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " 1 ~x" << _imp->variable_mappings[pair{q.first, t.first}] << " >= 1 ;\n";
                    ++_imp->proof_line;
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, t}, pair{q, t}}, _imp->proof_line);
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{q, t}, pair{p, t}}, _imp->proof_line);
                }
            }

    *_imp->proof_stream << "* hom clique non edges for variables\n";

    for (auto & p : _imp->p_clique)
        for (auto & [_, t] : _imp->t_clique_neighbourhood) {
            for (auto & [_, u] : _imp->t_clique_neighbourhood) {
                if (t != u) {
                    *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " 1 ~x" << _imp->variable_mappings[pair{p.first, u.first}] << " >= 1 ;\n";
                    ++_imp->proof_line;
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, t}, pair{p, u}}, _imp->proof_line);
                    _imp->clique_for_hom_non_edge_constraints.emplace(pair{pair{p, u}, pair{p, t}}, _imp->proof_line);
                }
            }
        }
}